

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorProto::Swap(DescriptorProto *this,DescriptorProto *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  MessageOptions *pMVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  
  if (other != this) {
    psVar3 = this->name_;
    this->name_ = other->name_;
    other->name_ = psVar3;
    internal::RepeatedPtrFieldBase::Swap
              (&(this->field_).super_RepeatedPtrFieldBase,
               &(other->field_).super_RepeatedPtrFieldBase);
    internal::RepeatedPtrFieldBase::Swap
              (&(this->extension_).super_RepeatedPtrFieldBase,
               &(other->extension_).super_RepeatedPtrFieldBase);
    internal::RepeatedPtrFieldBase::Swap
              (&(this->nested_type_).super_RepeatedPtrFieldBase,
               &(other->nested_type_).super_RepeatedPtrFieldBase);
    internal::RepeatedPtrFieldBase::Swap
              (&(this->enum_type_).super_RepeatedPtrFieldBase,
               &(other->enum_type_).super_RepeatedPtrFieldBase);
    internal::RepeatedPtrFieldBase::Swap
              (&(this->extension_range_).super_RepeatedPtrFieldBase,
               &(other->extension_range_).super_RepeatedPtrFieldBase);
    pMVar4 = this->options_;
    this->options_ = other->options_;
    other->options_ = pMVar4;
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    pvVar5 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar5;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void DescriptorProto::Swap(DescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    field_.Swap(&other->field_);
    extension_.Swap(&other->extension_);
    nested_type_.Swap(&other->nested_type_);
    enum_type_.Swap(&other->enum_type_);
    extension_range_.Swap(&other->extension_range_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}